

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O2

void __thiscall FileWriter::~FileWriter(FileWriter *this)

{
  (this->super_PacketWriter)._vptr_PacketWriter = (_func_int **)&PTR__FileWriter_0013f628;
  std::ofstream::~ofstream(&this->of_);
  std::__cxx11::string::~string((string *)&this->currentFilename_);
  std::__cxx11::string::~string((string *)&this->pattern_);
  PacketWriter::~PacketWriter(&this->super_PacketWriter);
  return;
}

Assistant:

FileWriter::~FileWriter() {
}